

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write_mutex_extension.h
# Opt level: O1

void __thiscall dlib::read_write_mutex::unlock(read_write_mutex *this)

{
  pthread_mutex_lock((pthread_mutex_t *)this);
  if (this[0x79] == (read_write_mutex)0x1) {
    *(undefined8 *)(this + 0x70) = *(undefined8 *)(this + 0x68);
    this[0x79] = (read_write_mutex)0x0;
    pthread_cond_broadcast((pthread_cond_t *)(this + 0x30));
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void unlock (
        ) const
        {
            m.lock();

            // only do something if there really was a lock in place
            if (write_lock_active)
            {
                available_locks = max_locks;
                write_lock_active = false;
                s.broadcast();
            }

            m.unlock();
        }